

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vle(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint64_t uVar2;
  TCGContext_conflict12 *s_00;
  TCGv_i64 addr;
  DisasJumpType DVar3;
  uint uVar4;
  TCGTemp *pTVar5;
  uintptr_t o_1;
  TCGv_i64 val;
  MemOp_conflict memop;
  
  if (((s->fields).presentO & 0x10) != 0) {
    uVar2 = s->insn->data;
    uVar1 = (s->fields).c[2];
    if ((0x10U >> ((byte)uVar2 & 0x1f)) - 1 < (uVar1 & 0xff)) {
      gen_program_exception(s,6);
      DVar3 = DISAS_NORETURN;
    }
    else {
      s_00 = s->uc->tcg_ctx;
      memop = (MemOp_conflict)uVar2 & 0xff;
      pTVar5 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
      val = (TCGv_i64)((long)pTVar5 - (long)s_00);
      addr = o->addr1;
      uVar4 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
      tcg_gen_qemu_ld_i64_s390x(s_00,val,addr,(ulong)uVar4,memop | MO_BE);
      if (((s->fields).presentO & 0x400000) == 0) goto LAB_00cca8c3;
      write_vec_element_i64(s_00,val,(s->fields).c[0],(uint8_t)uVar1,memop);
      tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(val + (long)s_00));
      DVar3 = DISAS_NEXT;
    }
    return DVar3;
  }
LAB_00cca8c3:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = s->insn->data;
    const uint8_t enr = get_field(s, m3);
    TCGv_i64 tmp;

    if (!valid_vec_element(enr, es)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_qemu_ld_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TE | es);
    write_vec_element_i64(tcg_ctx, tmp, get_field(s, v1), enr, es);
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}